

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int flags,
                     sqlite3_blob **ppBlob)

{
  short sVar1;
  Index *pIVar2;
  Op *pOVar3;
  FKey *pFVar4;
  uint uVar5;
  sqlite_int64 iRow_00;
  int iVar6;
  int iVar7;
  Incrblob *p;
  Parse *pParse;
  Table *pTVar8;
  Index **ppIVar9;
  Vdbe *p_00;
  FKey **ppFVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  char *local_90;
  int local_88;
  uint local_84;
  Parse *local_80;
  Incrblob *local_78;
  int local_70;
  int local_6c;
  char *local_68;
  sqlite3 *local_60;
  char *local_58;
  ulong local_50;
  char **local_48;
  sqlite_int64 local_40;
  char *local_38;
  
  local_90 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_88 = flags;
  local_68 = zTable;
  local_58 = zColumn;
  local_40 = iRow;
  local_38 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p = (Incrblob *)sqlite3DbMallocZero(db,0x28);
  pParse = (Parse *)0x0;
  if (p == (Incrblob *)0x0) {
LAB_0011cdcd:
    if (db->mallocFailed == '\0') {
      *ppBlob = (sqlite3_blob *)p;
      iVar7 = 0;
      goto LAB_0011ce48;
    }
    iVar7 = 0;
LAB_0011cdd7:
    if (p != (Incrblob *)0x0) goto LAB_0011ce2f;
  }
  else {
    pParse = (Parse *)sqlite3DbMallocRaw(db,0x298);
    if (pParse == (Parse *)0x0) {
      pParse = (Parse *)0x0;
      goto LAB_0011cdcd;
    }
    uVar5 = (uint)(flags != 0);
    local_70 = 4 - (uint)(local_88 != 0);
    local_50 = (ulong)((local_88 != 0) + 3);
    local_48 = &pParse->zErrMsg;
    local_84 = 0;
    local_80 = pParse;
    local_78 = p;
    local_60 = db;
    iVar6 = 0;
    do {
      local_6c = iVar6;
      memset(local_48,0,0x290);
      pParse->db = db;
      sqlite3DbFree(db,local_90);
      local_90 = (char *)0x0;
      sqlite3BtreeEnterAll(db);
      pTVar8 = sqlite3LocateTable(pParse,0,local_68,local_38);
      if (pTVar8 == (Table *)0x0) {
LAB_0011ce05:
        if (pParse->zErrMsg != (char *)0x0) {
          sqlite3DbFree(db,(void *)0x0);
          local_90 = pParse->zErrMsg;
          pParse->zErrMsg = (char *)0x0;
        }
        sqlite3BtreeLeaveAll(db);
        iVar7 = 1;
        goto LAB_0011ce2f;
      }
      if ((pTVar8->tabFlags & 0x10) != 0) {
        pcVar14 = "cannot open virtual table: %s";
LAB_0011cdf6:
        sqlite3ErrorMsg(pParse,pcVar14,local_68);
        goto LAB_0011ce05;
      }
      if (pTVar8->pSelect != (Select *)0x0) {
        pcVar14 = "cannot open view: %s";
        goto LAB_0011cdf6;
      }
      sVar1 = pTVar8->nCol;
      uVar16 = 0;
      if (0 < sVar1) {
        uVar16 = (ulong)(uint)(int)sVar1;
      }
      lVar13 = 0;
      for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
        iVar6 = sqlite3_stricmp(*(char **)((long)&pTVar8->aCol->zName + lVar13),local_58);
        if (iVar6 == 0) {
          uVar16 = uVar12 & 0xffffffff;
          break;
        }
        lVar13 = lVar13 + 0x30;
      }
      db = local_60;
      uVar15 = (uint)uVar16;
      if (uVar15 == (int)sVar1) {
        sqlite3DbFree(local_60,(void *)0x0);
        pcVar11 = "no such column: \"%s\"";
        pcVar14 = local_58;
LAB_0011cedf:
        local_90 = sqlite3MPrintf(db,pcVar11,pcVar14);
        sqlite3BtreeLeaveAll(db);
        iVar7 = 1;
        p = local_78;
        pParse = local_80;
        goto LAB_0011cdd7;
      }
      if (local_88 != 0) {
        if ((local_60->flags & 0x40000) == 0) {
          pcVar14 = (char *)0x0;
        }
        else {
          pcVar14 = (char *)0x0;
          ppFVar10 = &pTVar8->pFKey;
          while (pFVar4 = *ppFVar10, pFVar4 != (FKey *)0x0) {
            uVar16 = (ulong)(uint)pFVar4->nCol;
            if (pFVar4->nCol < 1) {
              uVar16 = 0;
            }
            for (lVar13 = 0; uVar16 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
              if (*(uint *)((long)&pFVar4->aCol[0].iFrom + lVar13) == uVar15) {
                pcVar14 = "foreign key";
              }
            }
            ppFVar10 = &pFVar4->pNextFrom;
          }
        }
        ppIVar9 = &pTVar8->pIndex;
        while (pIVar2 = *ppIVar9, pIVar2 != (Index *)0x0) {
          for (uVar16 = 0; pIVar2->nColumn != uVar16; uVar16 = uVar16 + 1) {
            if (pIVar2->aiColumn[uVar16] == uVar15) {
              pcVar14 = "indexed";
            }
          }
          ppIVar9 = &pIVar2->pNext;
        }
        if (pcVar14 != (char *)0x0) {
          sqlite3DbFree(local_60,(void *)0x0);
          pcVar11 = "cannot open %s column for writing";
          goto LAB_0011cedf;
        }
      }
      p_00 = sqlite3VdbeCreate(local_60);
      local_78->pStmt = (sqlite3_stmt *)p_00;
      if (p_00 != (Vdbe *)0x0) {
        iVar7 = sqlite3SchemaToIndex(db,pTVar8->pSchema);
        sqlite3VdbeAddOpList(p_00,0xc,sqlite3_blob_open::openBlob);
        iVar6 = p_00->nOp;
        if (iVar6 != 0) {
          pOVar3 = p_00->aOp;
          pOVar3->p1 = iVar7;
          pOVar3->p2 = uVar5;
          if (iVar6 != 1) {
            pOVar3[1].p1 = iVar7;
            iVar6 = pTVar8->pSchema->iGeneration;
            pOVar3[1].p2 = pTVar8->pSchema->schema_cookie;
            pOVar3[1].p3 = iVar6;
          }
        }
        sqlite3VdbeUsesBtree(p_00,iVar7);
        if (2 < (uint)p_00->nOp) {
          pOVar3 = p_00->aOp;
          pOVar3[2].p1 = iVar7;
          pOVar3[2].p2 = pTVar8->tnum;
          pOVar3[2].p3 = uVar5;
        }
        sqlite3VdbeChangeP4(p_00,2,pTVar8->zName,0);
        sqlite3VdbeChangeToNoop(p_00,local_70);
        if ((uint)local_50 < (uint)p_00->nOp) {
          pOVar3 = p_00->aOp;
          pOVar3[local_50].p2 = pTVar8->tnum;
          pOVar3[local_50].p3 = iVar7;
        }
        sqlite3VdbeChangeP4(p_00,(uint)local_50,(char *)((long)pTVar8->nCol + 1),-0xe);
        db = local_60;
        if (7 < (uint)p_00->nOp) {
          p_00->aOp[7].p2 = (int)pTVar8->nCol;
        }
        if (local_60->mallocFailed == '\0') {
          local_80->nVar = 1;
          local_80->nTab = 1;
          local_80->nMem = 1;
          sqlite3VdbeMakeReady(p_00,local_80);
        }
      }
      p = local_78;
      local_78->flags = uVar5;
      local_78->iCol = uVar15;
      local_78->db = db;
      sqlite3BtreeLeaveAll(db);
      iRow_00 = local_40;
      pParse = local_80;
      iVar7 = local_6c;
      if (db->mallocFailed != '\0') break;
      sqlite3_bind_int64(p->pStmt,1,local_40);
      iVar7 = blobSeekToRow(p,iRow_00,&local_90);
      if (0x30 < local_84) break;
      local_84 = local_84 + 1;
      iVar6 = 0x11;
    } while (iVar7 == 0x11);
    if (iVar7 == 0) goto LAB_0011cdcd;
LAB_0011ce2f:
    if ((Vdbe *)p->pStmt != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)p->pStmt);
    }
  }
  sqlite3DbFree(db,p);
LAB_0011ce48:
  pcVar11 = local_90;
  pcVar14 = "%s";
  if (local_90 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  sqlite3Error(db,iVar7,pcVar14,local_90);
  sqlite3DbFree(db,pcVar11);
  sqlite3DbFree(db,pParse);
  iVar6 = sqlite3ApiExit(db,iVar7);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar6;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int flags,              /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */

  /* This VDBE program seeks a btree cursor to the identified 
  ** db/table/row entry. The reason for using a vdbe program instead
  ** of writing code to use the b-tree layer directly is that the
  ** vdbe program will take advantage of the various transaction,
  ** locking and error handling infrastructure built into the vdbe.
  **
  ** After seeking the cursor, the vdbe executes an OP_ResultRow.
  ** Code external to the Vdbe then "borrows" the b-tree cursor and
  ** uses it to implement the blob_read(), blob_write() and 
  ** blob_bytes() functions.
  **
  ** The sqlite3_blob_close() function finalizes the vdbe program,
  ** which closes the b-tree cursor and (possibly) commits the 
  ** transaction.
  */
  static const VdbeOpList openBlob[] = {
    {OP_Transaction, 0, 0, 0},     /* 0: Start a transaction */
    {OP_VerifyCookie, 0, 0, 0},    /* 1: Check the schema cookie */
    {OP_TableLock, 0, 0, 0},       /* 2: Acquire a read or write lock */

    /* One of the following two instructions is replaced by an OP_Noop. */
    {OP_OpenRead, 0, 0, 0},        /* 3: Open cursor 0 for reading */
    {OP_OpenWrite, 0, 0, 0},       /* 4: Open cursor 0 for read/write */

    {OP_Variable, 1, 1, 1},        /* 5: Push the rowid to the stack */
    {OP_NotExists, 0, 10, 1},      /* 6: Seek the cursor */
    {OP_Column, 0, 0, 1},          /* 7  */
    {OP_ResultRow, 1, 0, 0},       /* 8  */
    {OP_Goto, 0, 5, 0},            /* 9  */
    {OP_Close, 0, 0, 0},           /* 10 */
    {OP_Halt, 0, 0, 0},            /* 11 */
  };

  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

  flags = !!flags;                /* flags = (flags ? 1 : 0); */
  *ppBlob = 0;

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    ** It is against the rules to open a column to which either of these
    ** descriptions applies for writing.  */
    if( flags ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nColumn; j++){
          if( pIdx->aiColumn[j]==iCol ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(db);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

      sqlite3VdbeAddOpList(v, sizeof(openBlob)/sizeof(VdbeOpList), openBlob);


      /* Configure the OP_Transaction */
      sqlite3VdbeChangeP1(v, 0, iDb);
      sqlite3VdbeChangeP2(v, 0, flags);

      /* Configure the OP_VerifyCookie */
      sqlite3VdbeChangeP1(v, 1, iDb);
      sqlite3VdbeChangeP2(v, 1, pTab->pSchema->schema_cookie);
      sqlite3VdbeChangeP3(v, 1, pTab->pSchema->iGeneration);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
      sqlite3VdbeChangeToNoop(v, 2);
#else
      sqlite3VdbeChangeP1(v, 2, iDb);
      sqlite3VdbeChangeP2(v, 2, pTab->tnum);
      sqlite3VdbeChangeP3(v, 2, flags);
      sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
#endif

      /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
      ** parameter of the other to pTab->tnum.  */
      sqlite3VdbeChangeToNoop(v, 4 - flags);
      sqlite3VdbeChangeP2(v, 3 + flags, pTab->tnum);
      sqlite3VdbeChangeP3(v, 3 + flags, iDb);

      /* Configure the number of columns. Configure the cursor to
      ** think that the table has one more column than it really
      ** does. An OP_Column to retrieve this imaginary column will
      ** always return an SQL NULL. This is useful because it means
      ** we can invoke OP_Column to fill in the vdbe cursors type 
      ** and offset cache without causing any IO.
      */
      sqlite3VdbeChangeP4(v, 3+flags, SQLITE_INT_TO_PTR(pTab->nCol+1),P4_INT32);
      sqlite3VdbeChangeP2(v, 7, pTab->nCol);
      if( !db->mallocFailed ){
        pParse->nVar = 1;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->flags = flags;
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    sqlite3_bind_int64(pBlob->pStmt, 1, iRow);
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3Error(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}